

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall hgdb::json::SymbolTable::ScopeVisitor::ScopeVisitor(ScopeVisitor *this)

{
  ScopeVisitor *this_local;
  
  this->_vptr_ScopeVisitor = (_func_int **)&PTR_handle_0059b8c8;
  return;
}

Assistant:

void visit(ScopeBase *scope) {
            if (auto *m = dynamic_cast<Module *>(scope)) {
                for (auto const &ss : *m) {
                    visit(ss.get());
                }
                handle(m);
            } else if (auto *v = dynamic_cast<VarStmt *>(scope)) {
                handle(v);
            } else if (auto *s = dynamic_cast<Scope<> *>(scope)) {
                for (auto const &ss : *s) {
                    visit(ss.get());
                }
                handle(s);
            }
        }